

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::cast_from_variable_load
          (CompilerMSL *this,uint32_t source_id,string *expr,SPIRType *expr_type)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  char (*pacVar4) [4];
  SPIRType *in_R8;
  char (*in_R9) [2];
  char (*in_stack_fffffffffffffb88) [3];
  spirv_cross *this_00;
  bool local_42b;
  bool local_42a;
  bool local_429;
  string local_420;
  spirv_cross local_400 [32];
  string local_3e0;
  string local_3c0;
  string local_3a0;
  undefined1 local_380 [8];
  uint32_t i;
  uint32_t array_size;
  undefined1 local_358 [8];
  string wrap_expr_1;
  string local_318;
  spirv_cross local_2f8 [32];
  undefined1 local_2d8 [8];
  string wrap_expr;
  uint32_t expected_width;
  BaseType expected_type;
  spirv_cross local_2a8 [4];
  BuiltIn builtin;
  string local_288;
  SPIRType *local_268;
  SPIRType *base_type;
  spirv_cross local_258 [32];
  string local_238;
  undefined1 local_218 [8];
  SPIRType matrix_type;
  spirv_cross local_b8 [32];
  string local_98;
  string local_78;
  bool local_55;
  uint32_t local_54;
  bool rewrite_boolean_load;
  SPIRType *pSStack_50;
  uint32_t phys_id;
  SPIRType *phys_type;
  SPIRType *var_type;
  SPIRVariable *var;
  SPIRExpression *source_expr;
  SPIRType *pSStack_28;
  bool is_packed;
  SPIRType *expr_type_local;
  string *expr_local;
  CompilerMSL *pCStack_10;
  uint32_t source_id_local;
  CompilerMSL *this_local;
  
  pSStack_28 = expr_type;
  expr_type_local = (SPIRType *)expr;
  expr_local._4_4_ = source_id;
  pCStack_10 = this;
  source_expr._7_1_ =
       Compiler::has_extended_decoration
                 ((Compiler *)this,source_id,SPIRVCrossDecorationPhysicalTypePacked);
  var = (SPIRVariable *)
        Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,expr_local._4_4_);
  var_type = (SPIRType *)Compiler::maybe_get_backing_variable((Compiler *)this,expr_local._4_4_);
  phys_type = (SPIRType *)0x0;
  pSStack_50 = (SPIRType *)0x0;
  local_54 = Compiler::get_extended_decoration
                       ((Compiler *)this,expr_local._4_4_,SPIRVCrossDecorationPhysicalTypeID);
  if (local_54 == 0) {
    pSStack_50 = pSStack_28;
  }
  else {
    pSStack_50 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_54);
  }
  if (var_type != (SPIRType *)0x0) {
    expr_local._4_4_ =
         TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_type->super_IVariant).self);
    phys_type = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)var_type);
  }
  local_429 = false;
  if (pSStack_28->basetype == Boolean) {
    local_42a = false;
    if (var_type != (SPIRType *)0x0) {
      local_42b = true;
      if (var_type->basetype != UByte) {
        local_42b = phys_type->basetype == Struct;
      }
      local_42a = local_42b;
    }
    local_429 = local_42a;
  }
  local_55 = local_429;
  if (local_429 != false) {
    bVar1 = Compiler::is_array((Compiler *)this,pSStack_28);
    if (bVar1) {
      in_R8 = pSStack_28;
      CompilerGLSL::to_rerolled_array_expression
                (&local_78,&this->super_CompilerGLSL,pSStack_28,(string *)expr_type_local,pSStack_28
                );
      ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_b8,this,pSStack_28,0);
      in_R8 = (SPIRType *)0x682405;
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_98,local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60,
                 (char (*) [2])expr_type_local,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,in_R9
                );
      ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)&local_98);
      ::std::__cxx11::string::~string((string *)&local_98);
      ::std::__cxx11::string::~string((string *)local_b8);
    }
  }
  bVar1 = Options::supports_msl_version(&this->msl_options,3,0,0);
  if ((!bVar1) && (var_type != (SPIRType *)0x0)) {
    if (var_type->basetype == UByte) {
LAB_00465ea7:
      if (1 < pSStack_28->columns) {
        SPIRType::SPIRType((SPIRType *)local_218,pSStack_50);
        if ((var != (SPIRVariable *)0x0) &&
           (((var->dereference_chain).stack_storage.aligned_char[1] & 1U) != 0)) {
          ::std::swap<unsigned_int>(&matrix_type.basetype,&matrix_type.width);
        }
        SmallVector<unsigned_int,_8UL>::clear
                  ((SmallVector<unsigned_int,_8UL> *)&matrix_type.vecsize);
        SmallVector<bool,_8UL>::clear
                  ((SmallVector<bool,_8UL> *)(matrix_type.array.stack_storage.aligned_char + 0x18));
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_258,this,local_218,0);
        in_R8 = (SPIRType *)0x682405;
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_238,local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60,
                   (char (*) [2])expr_type_local,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)&local_238);
        ::std::__cxx11::string::~string((string *)&local_238);
        ::std::__cxx11::string::~string((string *)local_258);
        SPIRType::~SPIRType((SPIRType *)local_218);
      }
    }
    else if (phys_type->basetype == Struct) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(phys_type->super_IVariant).self);
      bVar1 = Compiler::has_extended_decoration
                        ((Compiler *)this,uVar2,SPIRVCrossDecorationWorkgroupStruct);
      if ((bVar1) && ((source_expr._7_1_ & 1) == 0)) goto LAB_00465ea7;
    }
  }
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)((long)&base_type + 4),expr_local._4_4_);
  bVar1 = Compiler::has_decoration((Compiler *)this,base_type._4_4_,BuiltIn);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    if (var_type == (SPIRType *)0x0) {
      return;
    }
    if (var_type->basetype != Void) {
      return;
    }
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_type->super_IVariant).field_0xc)
    ;
    local_268 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    if (local_268->basetype == Struct) {
      return;
    }
    if (pSStack_28->basetype == local_268->basetype) {
      return;
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_2a8,this,pSStack_28,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_288,local_2a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60,
               (char (*) [2])expr_type_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,in_R9);
    ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::__cxx11::string::~string((string *)local_2a8);
    return;
  }
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)&expected_width,expr_local._4_4_);
  expected_type = Compiler::get_decoration((Compiler *)this,(ID)expected_width,BuiltIn);
  wrap_expr.field_2._12_4_ = pSStack_28->basetype;
  wrap_expr.field_2._8_4_ = pSStack_28->width;
  if ((expected_type != Int) && (1 < expected_type - Int64)) {
    if (expected_type - AtomicCounter < 2) {
      bVar1 = is_tesc_shader(this);
      if (bVar1) {
        wrap_expr.field_2._12_4_ = 0xc;
        wrap_expr.field_2._8_4_ = 0x10;
      }
      goto LAB_00466233;
    }
    if (((((expected_type != RayQuery) && (5 < expected_type + ~Char)) && (expected_type != 0x24))
        && ((2 < expected_type - 0x29 && (1 < expected_type - 0x1148)))) &&
       ((expected_type != 0x1158 && (expected_type != 0x1396)))) goto LAB_00466233;
  }
  wrap_expr.field_2._12_4_ = 8;
  wrap_expr.field_2._8_4_ = 0x20;
LAB_00466233:
  bVar1 = Compiler::is_array((Compiler *)this,pSStack_28);
  if ((bVar1) && (expected_type == RayQuery)) {
    pacVar4 = (char (*) [4])0x0;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_2f8,this,pSStack_28);
    join<std::__cxx11::string,char_const(&)[4]>
              ((string *)local_2d8,local_2f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"({ ",pacVar4);
    ::std::__cxx11::string::~string((string *)local_2f8);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_28->parent_type);
    pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              ((undefined1 *)((long)&wrap_expr_1.field_2 + 8),this,pSVar3,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_318,(spirv_cross *)(wrap_expr_1.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60,
               (char (*) [2])expr_type_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,in_R9);
    ::std::__cxx11::string::operator+=((string *)local_2d8,(string *)&local_318);
    ::std::__cxx11::string::~string((string *)&local_318);
    ::std::__cxx11::string::~string((string *)(wrap_expr_1.field_2._M_local_buf + 8));
    ::std::__cxx11::string::operator+=((string *)local_2d8," })");
    ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)local_2d8);
    ::std::__cxx11::string::~string((string *)local_2d8);
  }
  else if (wrap_expr.field_2._12_4_ != pSStack_28->basetype) {
    bVar1 = Compiler::is_array((Compiler *)this,pSStack_28);
    if ((bVar1) && ((expected_type == Half || (expected_type == AtomicCounter)))) {
      pacVar4 = (char (*) [4])0x0;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                ((spirv_cross *)&i,this,pSStack_28);
      join<std::__cxx11::string,char_const(&)[4]>
                ((string *)local_358,(spirv_cross *)&i,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"({ ",pacVar4)
      ;
      ::std::__cxx11::string::~string((string *)&i);
      local_380._4_4_ = get_physical_tess_level_array_size(this,expected_type);
      for (local_380._0_4_ = 0; (uint)local_380._0_4_ < (uint)local_380._4_4_;
          local_380._0_4_ = local_380._0_4_ + 1) {
        if ((uint)local_380._4_4_ < 2) {
          join<char_const(&)[7],std::__cxx11::string&,char_const(&)[2]>
                    (&local_3c0,(spirv_cross *)"float(",(char (*) [7])expr_type_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
                     (char (*) [2])in_R8);
          ::std::__cxx11::string::operator+=((string *)local_358,(string *)&local_3c0);
          ::std::__cxx11::string::~string((string *)&local_3c0);
        }
        else {
          in_R8 = (SPIRType *)local_380;
          join<char_const(&)[7],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                    (&local_3a0,(spirv_cross *)"float(",(char (*) [7])expr_type_local,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x623740,
                     (char (*) [2])in_R8,(uint *)0x676801,in_stack_fffffffffffffb88);
          ::std::__cxx11::string::operator+=((string *)local_358,(string *)&local_3a0);
          ::std::__cxx11::string::~string((string *)&local_3a0);
        }
        if (local_380._0_4_ + 1 < (uint)local_380._4_4_) {
          ::std::__cxx11::string::operator+=((string *)local_358,", ");
        }
      }
      bVar1 = Compiler::is_tessellating_triangles((Compiler *)this);
      if (bVar1) {
        ::std::__cxx11::string::operator+=((string *)local_358,", 0.0");
      }
      ::std::__cxx11::string::operator+=((string *)local_358," })");
      ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)local_358);
      ::std::__cxx11::string::~string((string *)local_358);
    }
    else if (wrap_expr.field_2._8_4_ == pSStack_28->width) {
      CompilerGLSL::bitcast_expression
                (&local_420,&this->super_CompilerGLSL,pSStack_28,wrap_expr.field_2._12_4_,
                 (string *)expr_type_local);
      ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)&local_420);
      ::std::__cxx11::string::~string((string *)&local_420);
    }
    else {
      this_00 = local_400;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(this_00,this,pSStack_28,0);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_3e0,this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60,
                 (char (*) [2])expr_type_local,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,in_R9
                );
      ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)&local_3e0);
      ::std::__cxx11::string::~string((string *)&local_3e0);
      ::std::__cxx11::string::~string((string *)local_400);
    }
  }
  return;
}

Assistant:

void CompilerMSL::cast_from_variable_load(uint32_t source_id, std::string &expr, const SPIRType &expr_type)
{
	bool is_packed = has_extended_decoration(source_id, SPIRVCrossDecorationPhysicalTypePacked);
	auto *source_expr = maybe_get<SPIRExpression>(source_id);
	auto *var = maybe_get_backing_variable(source_id);
	const SPIRType *var_type = nullptr, *phys_type = nullptr;

	if (uint32_t phys_id = get_extended_decoration(source_id, SPIRVCrossDecorationPhysicalTypeID))
		phys_type = &get<SPIRType>(phys_id);
	else
		phys_type = &expr_type;

	if (var)
	{
		source_id = var->self;
		var_type = &get_variable_data_type(*var);
	}

	bool rewrite_boolean_load =
	    expr_type.basetype == SPIRType::Boolean &&
	    (var && (var->storage == StorageClassWorkgroup || var_type->basetype == SPIRType::Struct));

	// Type fixups for workgroup variables if they are booleans.
	if (rewrite_boolean_load)
	{
		if (is_array(expr_type))
			expr = to_rerolled_array_expression(expr_type, expr, expr_type);
		else
			expr = join(type_to_glsl(expr_type), "(", expr, ")");
	}

	// Type fixups for workgroup variables if they are matrices.
	// Don't do fixup for packed types; those are handled specially.
	// FIXME: Maybe use a type like spvStorageMatrix for packed matrices?
	if (!msl_options.supports_msl_version(3, 0) && var &&
	    (var->storage == StorageClassWorkgroup ||
	     (var_type->basetype == SPIRType::Struct &&
	      has_extended_decoration(var_type->self, SPIRVCrossDecorationWorkgroupStruct) && !is_packed)) &&
	    expr_type.columns > 1)
	{
		SPIRType matrix_type = *phys_type;
		if (source_expr && source_expr->need_transpose)
			swap(matrix_type.vecsize, matrix_type.columns);
		matrix_type.array.clear();
		matrix_type.array_size_literal.clear();
		expr = join(type_to_glsl(matrix_type), "(", expr, ")");
	}

	// Only interested in standalone builtin variables in the switch below.
	if (!has_decoration(source_id, DecorationBuiltIn))
	{
		// If the backing variable does not match our expected sign, we can fix it up here.
		// See ensure_correct_input_type().
		if (var && var->storage == StorageClassInput)
		{
			auto &base_type = get<SPIRType>(var->basetype);
			if (base_type.basetype != SPIRType::Struct && expr_type.basetype != base_type.basetype)
				expr = join(type_to_glsl(expr_type), "(", expr, ")");
		}
		return;
	}

	auto builtin = static_cast<BuiltIn>(get_decoration(source_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;
	auto expected_width = expr_type.width;
	switch (builtin)
	{
	case BuiltInGlobalInvocationId:
	case BuiltInLocalInvocationId:
	case BuiltInWorkgroupId:
	case BuiltInLocalInvocationIndex:
	case BuiltInWorkgroupSize:
	case BuiltInNumWorkgroups:
	case BuiltInLayer:
	case BuiltInViewportIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInPrimitiveId:
	case BuiltInSubgroupSize:
	case BuiltInSubgroupLocalInvocationId:
	case BuiltInViewIndex:
	case BuiltInVertexIndex:
	case BuiltInInstanceIndex:
	case BuiltInBaseInstance:
	case BuiltInBaseVertex:
	case BuiltInSampleMask:
		expected_type = SPIRType::UInt;
		expected_width = 32;
		break;

	case BuiltInTessLevelInner:
	case BuiltInTessLevelOuter:
		if (is_tesc_shader())
		{
			expected_type = SPIRType::Half;
			expected_width = 16;
		}
		break;

	default:
		break;
	}

	if (is_array(expr_type) && builtin == BuiltInSampleMask)
	{
		// Needs special handling.
		auto wrap_expr = join(type_to_glsl(expr_type), "({ ");
		wrap_expr += join(type_to_glsl(get<SPIRType>(expr_type.parent_type)), "(", expr, ")");
		wrap_expr += " })";
		expr = std::move(wrap_expr);
	}
	else if (expected_type != expr_type.basetype)
	{
		if (is_array(expr_type) && (builtin == BuiltInTessLevelInner || builtin == BuiltInTessLevelOuter))
		{
			// Triggers when loading TessLevel directly as an array.
			// Need explicit padding + cast.
			auto wrap_expr = join(type_to_glsl(expr_type), "({ ");

			uint32_t array_size = get_physical_tess_level_array_size(builtin);
			for (uint32_t i = 0; i < array_size; i++)
			{
				if (array_size > 1)
					wrap_expr += join("float(", expr, "[", i, "])");
				else
					wrap_expr += join("float(", expr, ")");
				if (i + 1 < array_size)
					wrap_expr += ", ";
			}

			if (is_tessellating_triangles())
				wrap_expr += ", 0.0";

			wrap_expr += " })";
			expr = std::move(wrap_expr);
		}
		else
		{
			// These are of different widths, so we cannot do a straight bitcast.
			if (expected_width != expr_type.width)
				expr = join(type_to_glsl(expr_type), "(", expr, ")");
			else
				expr = bitcast_expression(expr_type, expected_type, expr);
		}
	}
}